

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

expected<const_Command::Arg_*,_Commands::MatchFailure> *
match_arg(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
         Commands *commands,shared_ptr<const_SyntaxTree> *hint,float arg,Arg *arginfo,
         SymTable *symtable,shared_ptr<Scope> *scope_ptr,Options *options)

{
  char cVar1;
  value_type pAVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  
  if (((ulong)(hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr &
      0x800) == 0) {
    pAVar2 = *(value_type *)&(commands->commands)._M_t._M_impl;
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            &(commands->commands)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = pAVar2;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this;
        (__return_storage_ptr__->contained).m_error.reason = LiteralValueDisallowed;
        if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return __return_storage_ptr__;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        return __return_storage_ptr__;
      }
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = pAVar2;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this;
    (__return_storage_ptr__->contained).m_error.reason = LiteralValueDisallowed;
  }
  else {
    cVar1 = *(char *)&(hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
    if ((cVar1 == '\x03') || (cVar1 == '\0')) {
      __return_storage_ptr__->has_value = true;
      (__return_storage_ptr__->contained).m_value = (value_type)hint;
    }
    else {
      make_expected_error(__return_storage_ptr__,(shared_ptr<const_SyntaxTree> *)commands,
                          (Arg *)hint);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static auto match_arg(const Commands& commands, const shared_ptr<const SyntaxTree>& hint,
                      float arg, const Command::Arg& arginfo, const SymTable& symtable,
                      const shared_ptr<Scope>& scope_ptr, const Options& options) -> expected<const Command::Arg*, MatchFailure>
{
    if(!arginfo.allow_constant)
        return make_unexpected(MatchFailure{ hint, MatchFailure::LiteralValueDisallowed });
    if(arginfo.type == ArgType::Float || arginfo.type == ArgType::Param)
        return &arginfo;
    return make_expected_error(hint, arginfo);
}